

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_bootstrap_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::anon_unknown_0::GenerateAndTest::Run
          (GenerateAndTest *this,FileDescriptor *proto_file,string *file1,string *file2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  pointer prVar5;
  Nonnull<const_char_*> failure_msg;
  pointer *__ptr;
  AlphaNum *c;
  char *in_R9;
  pointer *__ptr_2;
  pointer *__ptr_5;
  pointer *__ptr_4;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  string_view str;
  string expected_contents;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  string actual_contents;
  iterator it;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_158;
  size_t local_150;
  long local_148 [2];
  undefined1 local_138 [48];
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  Status local_a8;
  undefined1 local_a0 [32];
  string local_80;
  anon_union_8_1_a8a14541_for_iterator_2 local_60;
  char *local_58;
  undefined8 local_50;
  iterator local_40;
  
  local_108[0] = proto_file != (FileDescriptor *)0x0;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (proto_file == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_158);
    TestSourceDir_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_158._M_head_impl + 0x10),(char *)local_138._0_8_,local_138._8_8_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)local_108,(AssertionResult *)"proto_file != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
               ,0x5a,(char *)local_d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_d8 != (undefined1  [8])local_c8) {
      operator_delete((void *)local_d8,local_c8[0]._M_allocated_capacity + 1);
    }
    if ((AlphaNum *)local_138._0_8_ != (AlphaNum *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if (local_158._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_158._M_head_impl + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  if (proto_file != (FileDescriptor *)0x0) {
    c = (AlphaNum *)&this->error_;
    bVar3 = Generator::Generate(&this->generator_,proto_file,&this->parameter_,
                                &(this->context_).super_GeneratorContext,(string *)c);
    local_d8[0] = bVar3;
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar3) {
      testing::Message::Message((Message *)local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_138,(internal *)local_d8,
                 (AssertionResult *)
                 "generator_.Generate(proto_file, parameter_, &context_, &error_)","false","true",
                 in_R9);
      c = (AlphaNum *)local_138._0_8_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                 ,0x5c,(char *)local_138._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
      if ((AlphaNum *)local_138._0_8_ != (AlphaNum *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_108 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
    if (bVar3) {
      this_00 = &(this->context_).files_;
      local_40 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
                 ::find<std::__cxx11::string>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
                             *)this_00,file1);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)this_00);
      local_138._0_8_ = (char *)0x0;
      bVar3 = absl::lts_20250127::container_internal::operator==(&local_40,(iterator *)local_138);
      local_d8[0] = !bVar3;
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar3) {
        prVar5 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::iterator::operator->(&local_40);
        pbVar1 = (prVar5->second)._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        _Var2._M_p = (pbVar1->_M_dataplus)._M_p;
        local_158._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,_Var2._M_p,_Var2._M_p + pbVar1->_M_string_length);
        local_a0._8_8_ = 0;
        local_a0[0x10] = '\0';
        local_a0._0_8_ = (AssertHelperData *)(local_a0 + 0x10);
        TestSourceDir_abi_cxx11_();
        local_138._0_8_ = local_58;
        local_138._8_8_ = local_60;
        local_d8 = (undefined1  [8])0x1;
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13ab429;
        local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (file2->_M_dataplus)._M_p;
        local_108 = (undefined1  [8])file2->_M_string_length;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_80,(lts_20250127 *)local_138,(AlphaNum *)local_d8,(AlphaNum *)local_108,c)
        ;
        File::ReadFileToString((File *)&local_a8,&local_80,(string *)local_a0,true);
        if ((StatusRep *)local_a8.rep_ == (StatusRep *)0x1) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                                  (&local_a8,
                                   "File::GetContentsAsText( absl::StrCat(TestSourceDir(), \"/\", physical_filename), &actual_contents, true) is OK"
                                  );
        }
        if ((local_a8.rep_ & 1) == 0) {
          absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_a8.rep_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_60.slot_ != (slot_type *)&stack0xffffffffffffffb0) {
          operator_delete(local_60.slot_,(ulong)(local_50 + 1));
        }
        if ((StatusRep *)local_a8.rep_ != (StatusRep *)0x1) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                     ,0x41,failure_msg);
          str._M_str = "Unable to get ";
          str._M_len = 0xe;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_138,str);
          absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)local_138,file2);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_138);
        }
        if (local_a0._8_8_ == local_150) {
          if (local_a0._8_8_ == 0) {
            bVar3 = true;
          }
          else {
            iVar4 = bcmp((void *)local_a0._0_8_,local_158._M_head_impl,local_a0._8_8_);
            bVar3 = iVar4 == 0;
          }
        }
        else {
          bVar3 = false;
        }
        local_d8[0] = bVar3;
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar3 == false) {
          testing::Message::Message((Message *)local_108);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_108 + 0x10),(file2->_M_dataplus)._M_p,
                     file2->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_108 + 0x10),
                     " needs to be regenerated.  Please run generate_descriptor_proto.sh. Then add this file to your CL."
                     ,0x62);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_138,(internal *)local_d8,
                     (AssertionResult *)"actual_contents == expected_contents","false","true",in_R9)
          ;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                     ,0x43,(char *)local_138._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_108)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
          if (local_108 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_108 + 8))();
          }
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        if ((AssertHelperData *)local_a0._0_8_ != (AssertHelperData *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
        }
        if (local_158._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148) {
          operator_delete(local_158._M_head_impl,local_148[0] + 1);
        }
      }
      else {
        testing::Message::Message((Message *)local_108);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_108 + 0x10),"Generator failed to generate file: ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_108 + 0x10),(file1->_M_dataplus)._M_p,
                   file1->_M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_138,(internal *)local_d8,(AssertionResult *)"it != files_.end()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                   ,0x3a,(char *)local_138._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)local_108);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
        if (local_108 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_108 + 8))();
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
      }
    }
  }
  return;
}

Assistant:

void Run(const FileDescriptor* proto_file, std::string file1,
           std::string file2) {
    ASSERT_TRUE(proto_file != nullptr) << TestSourceDir();
    ASSERT_TRUE(generator_.Generate(proto_file, parameter_,
                                    &context_, &error_));
    context_.ExpectFileMatches(file1, file2);
  }